

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O2

void readbyte(void)

{
  c = l;
  l = fgetc((FILE *)f);
  return;
}

Assistant:

void readbyte()
{
    prev = c;
    c = l;
    l = fgetc(f);

    if (c == '\n')
    {
        if (l == '\r')
        {
            prev = c;
            c = '\n';
            l = fgetc(f);
        }
        ++line;
        column = 0;
    }
    else if (c == '\r')
    {
        if (l == '\n')
        {
            prev = c;
            c = l;
            l = fgetc(f);
        }
        ++line;
        column = 0;
        c = '\n';
    }
    else if (c == '\t')
    {
        column += tabstop - (column % tabstop);
    }
    else if (c == '\v')
    {
        line += 8 - (line % 8);
        column = 0;
        c = '\n';
    }
    else
        ++column;
}